

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void draw_width(int x,int y,int r,Fl_Align a)

{
  uint uVar1;
  uint y_00;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  char buf [16];
  char local_48 [24];
  
  uVar3 = r - x;
  sprintf(local_48,"%d",(ulong)uVar3);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])(fl_graphics_driver,0,9);
  dVar5 = fl_width(local_48);
  iVar4 = (int)dVar5;
  uVar1 = y + 4;
  if ((int)(uVar3 - 0x14) < iVar4) {
    y_00 = y - 6;
    if (a != 1) {
      y_00 = y + 0xe;
    }
    uVar2 = (ulong)(uint)x;
  }
  else {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(uint)x,y,
               (ulong)(uint)(((int)(((uVar3 - iVar4) - ((int)((uVar3 - iVar4) + -2) >> 0x1f)) + -2)
                             >> 1) + x));
    uVar2 = (ulong)(uint)(((int)(((uVar3 + iVar4) - ((int)(uVar3 + iVar4 + 2) >> 0x1f)) + 2) >> 1) +
                         x);
    y_00 = uVar1;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])(fl_graphics_driver,uVar2,y);
  fl_draw(local_48,(int)(uVar3 - iVar4) / 2 + x,y_00);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 5U),(ulong)(y - 2U),(ulong)(x + 1),y,(ulong)(x + 5U),
             y + 2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(r - 6U),(ulong)(y - 2U),(ulong)(r - 2),y,(ulong)(r - 6U),
             y + 2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(y - 4U),(ulong)uVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(r - 1),(ulong)(y - 4U),(ulong)uVar1);
  return;
}

Assistant:

static void draw_width(int x, int y, int r, Fl_Align a) {
  char buf[16];
  int w = r-x;
  sprintf(buf, "%d", w);
  fl_font(FL_HELVETICA, 9);
  int lw = (int)fl_width(buf);
  int ly = y + 4;

  r --;

  if (lw > (w - 20)) {
    // Move width above/below the arrows...
    if (a == FL_ALIGN_TOP) ly -= 10;
    else ly += 10;

    fl_xyline(x, y, r);
  } else {
    // Put width inside the arrows...
    fl_xyline(x, y, x + (w - lw - 2) / 2);
    fl_xyline(x + (w + lw + 2) / 2, y, r);
  }

  // Draw the width...
  fl_draw(buf, x + (w - lw) / 2, ly);

  // Draw the arrowheads...
  fl_line(x+5, y-2, x+1, y, x+5, y+2);
  fl_line(r-5, y-2, r-1, y, r-5, y+2);

  // Draw the end lines...
  fl_yxline(x, y - 4, y + 4);
  fl_yxline(r, y - 4, y + 4);
}